

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

Gia_Man_t *
Gia_ManIsoReduce(Gia_Man_t *pInit,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                int fDualOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  bool bVar2;
  Vec_Ptr_t **ppVVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *pGVar9;
  Vec_Ptr_t *__ptr;
  uint *puVar10;
  void *pvVar11;
  void *pvVar12;
  Vec_Str_t *__ptr_00;
  undefined8 *puVar13;
  Vec_Int_t *p;
  int *piVar14;
  Vec_Int_t *p_00;
  Vec_Int_t **pvPiPerm;
  long lVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  int iPo;
  timespec ts;
  int local_ac;
  uint *local_a8;
  Gia_Man_t *local_a0;
  Vec_Ptr_t *local_98;
  void *local_90;
  Gia_Man_t *local_88;
  int local_80;
  int local_7c;
  timespec local_78;
  ulong local_68;
  int local_5c;
  long local_58;
  Gia_Man_t *local_50;
  Vec_Ptr_t **local_48;
  Vec_Ptr_t **local_40;
  long local_38;
  
  local_7c = fVerbose;
  iVar4 = clock_gettime(3,&local_78);
  if (iVar4 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    *pvPosEquivs = (Vec_Ptr_t *)0x0;
  }
  local_48 = pvPiPerms;
  if (pvPiPerms != (Vec_Ptr_t **)0x0) {
    lVar21 = (long)pInit->vCos->nSize - (long)pInit->nRegs;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = (int)lVar21;
    iVar18 = 8;
    if (6 < iVar4 - 1U) {
      iVar18 = iVar4;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar18;
    if (iVar18 == 0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = (void **)malloc((long)iVar18 << 3);
    }
    pVVar6->pArray = ppvVar7;
    pVVar6->nSize = iVar4;
    memset(ppvVar7,0,lVar21 * 8);
    *local_48 = pVVar6;
  }
  uVar5 = pInit->vCos->nSize - pInit->nRegs;
  if (fDualOut == 0) {
    pGVar9 = pInit;
    if (uVar5 == 1) goto LAB_006c3366;
  }
  else {
    if ((uVar5 & 1) != 0) {
      __assert_fail("(Gia_ManPoNum(pInit) & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso.c"
                    ,0x443,
                    "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                   );
    }
    if (uVar5 == 2) goto LAB_006c3366;
    pGVar8 = Gia_ManTransformMiter(pInit);
    pGVar9 = Gia_ManSeqStructSweep(pGVar8,1,1,0);
    Gia_ManStop(pGVar8);
  }
  local_a0 = pGVar9;
  pVVar6 = Gia_IsoDeriveEquivPos(pGVar9,1,fVeryVerbose);
  pGVar9 = local_a0;
  if (pVVar6 == (Vec_Ptr_t *)0x0) {
    if (fDualOut != 0) {
      Gia_ManStop(local_a0);
    }
    return (Gia_Man_t *)0x0;
  }
  uVar5 = pVVar6->nSize;
  lVar21 = (long)(int)uVar5;
  if (lVar21 < 1) {
    uVar22 = 0;
    uVar19 = 0;
  }
  else {
    uVar22 = 0;
    lVar17 = 0;
    uVar19 = 0;
    do {
      iVar4 = *(int *)((long)pVVar6->pArray[lVar17] + 4);
      bVar2 = 1 < iVar4;
      if (iVar4 < 2) {
        iVar4 = 0;
      }
      uVar22 = (ulong)(uint)((int)uVar22 + iVar4);
      uVar19 = (ulong)((int)uVar19 + (uint)bVar2);
      lVar17 = lVar17 + 1;
    } while (lVar21 != lVar17);
  }
  local_80 = fDualOut;
  local_50 = pInit;
  local_40 = pvPosEquivs;
  printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
         ,(ulong)(uint)(local_a0->vCos->nSize - local_a0->nRegs),(ulong)uVar5,uVar22,uVar19);
  iVar18 = 3;
  iVar4 = clock_gettime(3,&local_78);
  if (iVar4 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  Abc_Print(iVar18,"%s =","Time");
  Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar17 - lVar15) / 1000000.0);
  pInit = local_50;
  local_98 = pVVar6;
  if (fEstimate == 0) {
    __ptr = (Vec_Ptr_t *)malloc(0x10);
    __ptr->nCap = 100;
    __ptr->nSize = 0;
    ppvVar7 = (void **)malloc(800);
    __ptr->pArray = ppvVar7;
    uVar5 = pVVar6->nSize;
    iVar4 = 0;
    local_58 = lVar15;
    if (0 < (int)uVar5) {
      uVar22 = 0;
      uVar19 = 0;
      do {
        pvVar11 = pVVar6->pArray[uVar22];
        uVar5 = *(uint *)((long)pvVar11 + 4);
        lVar15 = (long)(int)uVar5;
        local_90 = pvVar11;
        local_68 = uVar22;
        if (lVar15 < 2) {
          puVar10 = (uint *)malloc(0x10);
          puVar10[1] = uVar5;
          *puVar10 = uVar5;
          if (uVar5 == 0) {
            pvVar11 = (void *)0x0;
          }
          else {
            pvVar11 = malloc(lVar15 * 4);
          }
          *(void **)(puVar10 + 2) = pvVar11;
          memcpy(pvVar11,*(void **)((long)local_90 + 8),lVar15 << 2);
          uVar5 = __ptr->nCap;
          if (__ptr->nSize == uVar5) {
            if ((int)uVar5 < 0x10) {
              if (__ptr->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(__ptr->pArray,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar5 * 2;
              if (iVar4 <= (int)uVar5) goto LAB_006c3886;
              if (__ptr->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(__ptr->pArray,(ulong)uVar5 << 4);
              }
            }
            __ptr->pArray = ppvVar7;
            __ptr->nCap = iVar4;
          }
LAB_006c3886:
          uVar22 = local_68;
          pvVar11 = local_90;
          iVar4 = __ptr->nSize;
          __ptr->nSize = iVar4 + 1;
          __ptr->pArray[iVar4] = puVar10;
          if (0 < *(int *)((long)local_90 + 4)) {
            iVar4 = 0;
            do {
              iVar18 = (int)uVar19;
              uVar19 = (ulong)(iVar18 + 1);
              uVar5 = iVar18 * -0x3d70a3d7 + 0xc7ae1479;
              if ((uVar5 >> 2 | uVar5 * 0x40000000) < 0x28f5c29) {
                printf("%6d finished...\r",uVar19);
              }
              iVar4 = iVar4 + 1;
            } while (iVar4 < *(int *)((long)pvVar11 + 4));
          }
        }
        else {
          if (local_7c != 0) {
            local_ac = **(int **)((long)pvVar11 + 8);
            printf("%6d %6d %6d : ",uVar22 & 0xffffffff,(ulong)uVar5);
            pGVar8 = Gia_ManDupCones(pGVar9,&local_ac,1,1);
            Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
            Gia_ManStop(pGVar8);
          }
          local_5c = __ptr->nSize;
          puVar10 = (uint *)malloc(0x10);
          puVar10[0] = 100;
          puVar10[1] = 0;
          pvVar12 = malloc(800);
          *(void **)(puVar10 + 2) = pvVar12;
          local_a8 = puVar10;
          if (0 < *(int *)((long)pvVar11 + 4)) {
            lVar15 = 0;
            do {
              ppVVar3 = local_48;
              local_ac = *(int *)(*(long *)((long)pvVar11 + 8) + lVar15 * 4);
              uVar16 = (int)uVar19 + 1;
              uVar5 = (int)uVar19 * -0x3d70a3d7 + 0xc7ae1479;
              if ((uVar5 >> 2 | uVar5 * 0x40000000) < 0x28f5c29) {
                printf("%6d finished...\r",(ulong)uVar16);
              }
              if ((ppVVar3 != (Vec_Ptr_t **)0x0) && ((*ppVVar3)->pArray[local_ac] != (void *)0x0)) {
                __assert_fail("pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso.c"
                              ,0x480,
                              "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                             );
              }
              local_88 = (Gia_Man_t *)CONCAT44(local_88._4_4_,uVar16);
              if (ppVVar3 == (Vec_Ptr_t **)0x0) {
                pvPiPerm = (Vec_Int_t **)0x0;
              }
              else {
                pvPiPerm = (Vec_Int_t **)((*ppVVar3)->pArray + local_ac);
              }
              uVar16 = 0;
              local_38 = lVar15;
              __ptr_00 = Gia_ManIsoFindString(pGVar9,local_ac,0,pvPiPerm);
              uVar5 = puVar10[1];
              if (0 < (long)(int)uVar5) {
                lVar15 = *(long *)(puVar10 + 2);
                uVar22 = 0;
                do {
                  lVar21 = *(long *)(lVar15 + uVar22 * 8);
                  if ((__ptr_00 == (Vec_Str_t *)0x0) || (lVar21 == 0)) {
                    iVar4 = ((__ptr_00 != (Vec_Str_t *)0x0) - 1) + (uint)(lVar21 == 0);
                  }
                  else {
                    iVar4 = __ptr_00->nSize;
                    if (iVar4 == *(int *)(lVar21 + 4)) {
                      iVar4 = memcmp(__ptr_00->pArray,*(void **)(lVar21 + 8),(long)iVar4);
                    }
                    else {
                      iVar4 = iVar4 - *(int *)(lVar21 + 4);
                    }
                  }
                  uVar19 = uVar22;
                } while ((iVar4 != 0) &&
                        (uVar22 = uVar22 + 1, uVar19 = (ulong)uVar5, uVar5 != uVar22));
                uVar16 = (uint)uVar19;
                pGVar9 = local_a0;
                puVar10 = local_a8;
              }
              pvVar11 = local_90;
              if (uVar16 == uVar5) {
                uVar1 = *puVar10;
                if (uVar5 == uVar1) {
                  if ((int)uVar1 < 0x10) {
                    if (*(void **)(local_a8 + 2) == (void *)0x0) {
                      pvVar12 = malloc(0x80);
                    }
                    else {
                      pvVar12 = realloc(*(void **)(local_a8 + 2),0x80);
                    }
                    uVar20 = 0x10;
                  }
                  else {
                    uVar20 = uVar1 * 2;
                    puVar10 = local_a8;
                    if ((int)uVar20 <= (int)uVar1) goto LAB_006c366e;
                    if (*(void **)(local_a8 + 2) == (void *)0x0) {
                      pvVar12 = malloc((ulong)uVar1 << 4);
                    }
                    else {
                      pvVar12 = realloc(*(void **)(local_a8 + 2),(ulong)uVar1 << 4);
                    }
                  }
                  *(void **)(local_a8 + 2) = pvVar12;
                  *local_a8 = uVar20;
                  puVar10 = local_a8;
                }
LAB_006c366e:
                puVar10[1] = uVar5 + 1;
                *(Vec_Str_t **)(*(long *)(puVar10 + 2) + (long)(int)uVar5 * 8) = __ptr_00;
                puVar13 = (undefined8 *)malloc(0x10);
                *puVar13 = 0x10;
                pvVar12 = malloc(0x40);
                puVar13[1] = pvVar12;
                uVar5 = __ptr->nCap;
                uVar19 = (ulong)local_88 & 0xffffffff;
                if (__ptr->nSize == uVar5) {
                  if ((int)uVar5 < 0x10) {
                    if (__ptr->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(__ptr->pArray,0x80);
                    }
                    iVar4 = 0x10;
                  }
                  else {
                    iVar4 = uVar5 * 2;
                    if (iVar4 <= (int)uVar5) goto LAB_006c370d;
                    if (__ptr->pArray == (void **)0x0) {
                      ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
                    }
                    else {
                      ppvVar7 = (void **)realloc(__ptr->pArray,(ulong)uVar5 << 4);
                    }
                  }
                  __ptr->pArray = ppvVar7;
                  __ptr->nCap = iVar4;
                }
LAB_006c370d:
                iVar4 = __ptr->nSize;
                __ptr->nSize = iVar4 + 1;
                __ptr->pArray[iVar4] = puVar13;
                puVar10 = local_a8;
              }
              else {
                if (__ptr_00->pArray != (char *)0x0) {
                  free(__ptr_00->pArray);
                  __ptr_00->pArray = (char *)0x0;
                }
                uVar19 = (ulong)local_88 & 0xffffffff;
                if (__ptr_00 != (Vec_Str_t *)0x0) {
                  free(__ptr_00);
                }
              }
              uVar16 = uVar16 + local_5c;
              if (((int)uVar16 < 0) || (__ptr->nSize <= (int)uVar16)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              Vec_IntPush((Vec_Int_t *)__ptr->pArray[uVar16],local_ac);
              lVar15 = local_38 + 1;
            } while (lVar15 < *(int *)((long)pvVar11 + 4));
          }
          uVar5 = puVar10[1];
          if (0 < (long)(int)uVar5) {
            lVar15 = *(long *)(local_a8 + 2);
            lVar21 = 0;
            do {
              pvVar11 = *(void **)(lVar15 + lVar21 * 8);
              if (pvVar11 != (void *)0x0) {
                if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar11 + 8));
                  *(undefined8 *)((long)pvVar11 + 8) = 0;
                }
                free(pvVar11);
              }
              lVar21 = lVar21 + 1;
            } while ((int)uVar5 != lVar21);
          }
          puVar10 = local_a8;
          if (*(void **)(local_a8 + 2) != (void *)0x0) {
            free(*(void **)(local_a8 + 2));
            puVar10[2] = 0;
            puVar10[3] = 0;
          }
          free(puVar10);
          pGVar9 = local_a0;
          pVVar6 = local_98;
          uVar22 = local_68;
        }
        iVar4 = (int)uVar19;
        uVar22 = uVar22 + 1;
        uVar5 = pVVar6->nSize;
      } while ((long)uVar22 < (long)(int)uVar5);
    }
    if (iVar4 != pGVar9->vCos->nSize - pGVar9->nRegs) {
      __assert_fail("Counter == Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIso.c"
                    ,0x499,
                    "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                   );
    }
    qsort(__ptr->pArray,(long)__ptr->nSize,8,Vec_VecSortCompare3);
    if (0 < (int)uVar5) {
      ppvVar7 = local_98->pArray;
      uVar22 = 0;
      do {
        pvVar11 = ppvVar7[uVar22];
        if (pvVar11 != (void *)0x0) {
          if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar11 + 8));
            *(undefined8 *)((long)pvVar11 + 8) = 0;
          }
          free(pvVar11);
        }
        uVar22 = uVar22 + 1;
      } while (uVar5 != uVar22);
    }
    pVVar6 = local_98;
    if (local_98->pArray != (void **)0x0) {
      free(local_98->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar14 = (int *)malloc(400);
    iVar4 = local_80;
    p->pArray = piVar14;
    if (0 < __ptr->nSize) {
      lVar15 = 0;
      do {
        if (*(int *)((long)__ptr->pArray[lVar15] + 4) < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p,**(int **)((long)__ptr->pArray[lVar15] + 8));
        lVar15 = lVar15 + 1;
      } while (lVar15 < __ptr->nSize);
    }
    pGVar9 = local_a0;
    if (iVar4 != 0) {
      uVar5 = p->nSize;
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar16 = 0x10;
      if (0xe < uVar5 - 1) {
        uVar16 = uVar5;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar16;
      if (uVar16 == 0) {
        piVar14 = (int *)0x0;
      }
      else {
        piVar14 = (int *)malloc((long)(int)uVar16 << 2);
      }
      p_00->pArray = piVar14;
      if (0 < (int)uVar5) {
        piVar14 = p->pArray;
        uVar22 = 0;
        do {
          iVar4 = piVar14[uVar22];
          Vec_IntPush(p_00,iVar4 * 2);
          Vec_IntPush(p_00,iVar4 * 2 + 1);
          uVar22 = uVar22 + 1;
        } while (uVar5 != uVar22);
      }
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      Gia_ManStop(local_a0);
      pGVar9 = local_50;
      p = p_00;
      iVar4 = local_80;
    }
    uVar5 = 0;
    pGVar8 = Gia_ManDupCones(pGVar9,p->pArray,p->nSize,0);
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    lVar15 = (long)__ptr->nSize;
    uVar22 = 0;
    if (0 < lVar15) {
      uVar5 = 0;
      lVar21 = 0;
      uVar22 = 0;
      do {
        iVar18 = *(int *)((long)__ptr->pArray[lVar21] + 4);
        bVar2 = 1 < iVar18;
        if (iVar18 < 2) {
          iVar18 = 0;
        }
        uVar5 = uVar5 + iVar18;
        uVar22 = (ulong)((int)uVar22 + (uint)bVar2);
        lVar21 = lVar21 + 1;
      } while (lVar15 != lVar21);
    }
    uVar16 = pGVar9->vCos->nSize - pGVar9->nRegs;
    if (iVar4 == 0) {
      printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
             ,(ulong)uVar16,lVar15,(ulong)uVar5,uVar22);
    }
    else {
      uVar5 = pGVar8->vCos->nSize - pGVar8->nRegs;
      printf("Reduced %d dual outputs to %d dual outputs.  ",(ulong)(uint)((int)uVar16 / 2),
             (ulong)(uint)((int)uVar5 / 2),(ulong)uVar5,uVar22);
    }
    lVar15 = local_58;
    iVar18 = 3;
    iVar4 = clock_gettime(3,&local_78);
    if (iVar4 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    local_88 = pGVar8;
    Abc_Print(iVar18,"%s =","Time");
    Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar21 - lVar15) / 1000000.0);
    if ((local_7c != 0) && (puts("Nontrivial classes:"), 0 < __ptr->nSize)) {
      uVar22 = 0;
      do {
        if ((long)__ptr->nSize <= (long)uVar22) {
LAB_006c3d84:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        uVar19 = 0;
        while( true ) {
          iVar4 = *(int *)((long)__ptr->pArray[uVar22] + 4);
          if (((long)iVar4 <= (long)uVar19) || (iVar4 == 1)) break;
          uVar5 = *(uint *)(*(long *)((long)__ptr->pArray[uVar22] + 8) + uVar19 * 4);
          if (uVar19 == 0) {
            printf(" %4d : {",uVar22 & 0xffffffff);
          }
          printf(" %d",(ulong)uVar5);
          if ((long)__ptr->nSize <= (long)uVar22) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                          ,0x100,"int Vec_VecLevelSize(Vec_Vec_t *, int)");
          }
          if (uVar19 == *(int *)((long)__ptr->pArray[uVar22] + 4) - 1) {
            puts(" }");
          }
          uVar19 = uVar19 + 1;
          if ((long)__ptr->nSize <= (long)uVar22) goto LAB_006c3d84;
        }
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 < (long)__ptr->nSize);
    }
    pGVar9 = local_88;
    if (local_40 != (Vec_Ptr_t **)0x0) {
      *local_40 = __ptr;
      return local_88;
    }
    if (0 < __ptr->nSize) {
      lVar15 = 0;
      do {
        pvVar11 = __ptr->pArray[lVar15];
        if (pvVar11 != (void *)0x0) {
          if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar11 + 8));
            *(undefined8 *)((long)pvVar11 + 8) = 0;
          }
          free(pvVar11);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
    return pGVar9;
  }
  if (0 < (int)uVar5) {
    ppvVar7 = pVVar6->pArray;
    lVar15 = 0;
    do {
      pvVar11 = ppvVar7[lVar15];
      if (pvVar11 != (void *)0x0) {
        if (*(void **)((long)pvVar11 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar11 + 8));
          *(undefined8 *)((long)pvVar11 + 8) = 0;
        }
        free(pvVar11);
      }
      lVar15 = lVar15 + 1;
    } while (lVar21 != lVar15);
  }
  pVVar6 = local_98;
  if (local_98->pArray != (void **)0x0) {
    free(local_98->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  free(pVVar6);
LAB_006c3366:
  pGVar9 = Gia_ManDup(pInit);
  return pGVar9;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce( Gia_Man_t * pInit, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fDualOut, int fVerbose, int fVeryVerbose )
{ 
    Gia_Man_t * p, * pPart;
    Vec_Ptr_t * vEquivs, * vEquivs2, * vStrings;
    Vec_Int_t * vRemain, * vLevel, * vLevel2;
    Vec_Str_t * vStr, * vStr2;
    int i, k, s, sStart, iPo, Counter;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    if ( pvPosEquivs )
        *pvPosEquivs = NULL;
    if ( pvPiPerms )
        *pvPiPerms = Vec_PtrStart( Gia_ManPoNum(pInit) );

    if ( fDualOut )
    {
        assert( (Gia_ManPoNum(pInit) & 1) == 0 );
        if ( Gia_ManPoNum(pInit) == 2 )
            return Gia_ManDup(pInit);
        p = Gia_ManTransformMiter( pInit );
        p = Gia_ManSeqStructSweep( pPart = p, 1, 1, 0 );
        Gia_ManStop( pPart );
    }
    else
    {
        if ( Gia_ManPoNum(pInit) == 1 )
            return Gia_ManDup(pInit);
        p = pInit;
    }

    // create preliminary equivalences
    vEquivs = Gia_IsoDeriveEquivPos( p, 1, fVeryVerbose );
    if ( vEquivs == NULL )
    {
        if ( fDualOut )
            Gia_ManStop( p );
        return NULL;
    }
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
        return Gia_ManDup(pInit);
    }

    // perform refinement of equivalence classes
    Counter = 0;
    vEquivs2 = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) < 2 )
        {
            Vec_PtrPush( vEquivs2, Vec_IntDup(vLevel) );
            for ( k = 0; k < Vec_IntSize(vLevel); k++ )
                if ( ++Counter % 100 == 0 )
                    printf( "%6d finished...\r", Counter );
            continue;
        }

        if ( fVerbose )
        {
            iPo = Vec_IntEntry(vLevel, 0);
            printf( "%6d %6d %6d : ", i, Vec_IntSize(vLevel), iPo );
            pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
            Gia_ManPrintStats(pPart, NULL);
            Gia_ManStop( pPart );
        }

        sStart = Vec_PtrSize( vEquivs2 ); 
        vStrings = Vec_PtrAlloc( 100 );
        Vec_IntForEachEntry( vLevel, iPo, k )
        {
            if ( ++Counter % 100 == 0 )
                printf( "%6d finished...\r", Counter );
            assert( pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL );
            vStr = Gia_ManIsoFindString( p, iPo, 0, pvPiPerms ? (Vec_Int_t **)Vec_PtrArray(*pvPiPerms) + iPo : NULL );

//            printf( "Output %2d : ", iPo );
//            Vec_IntPrint( Vec_PtrArray(*pvPiPerms)[iPo] );

            // check if this string already exists
            Vec_PtrForEachEntry( Vec_Str_t *, vStrings, vStr2, s )
                if ( Vec_StrCompareVec(vStr, vStr2) == 0 )
                    break;
            if ( s == Vec_PtrSize(vStrings) )
            {
                Vec_PtrPush( vStrings, vStr );
                Vec_PtrPush( vEquivs2, Vec_IntAlloc(8) );
            }
            else
                Vec_StrFree( vStr );
            // add this entry to the corresponding level
            vLevel2 = (Vec_Int_t *)Vec_PtrEntry( vEquivs2, sStart + s );
            Vec_IntPush( vLevel2, iPo );
        }
//        if ( Vec_PtrSize(vEquivs2) - sStart > 1 )
//            printf( "Refined class %d into %d classes.\n", i, Vec_PtrSize(vEquivs2) - sStart );
        Vec_VecFree( (Vec_Vec_t *)vStrings );
    }
    assert( Counter == Gia_ManPoNum(p) );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vEquivs2, 0 );
    Vec_VecFree( (Vec_Vec_t *)vEquivs );
    vEquivs = vEquivs2;

    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    if ( fDualOut )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vRemain) );
        int i, Entry;
        Vec_IntForEachEntry( vRemain, Entry, i )
        {
//            printf( "%d ", Entry );
            Vec_IntPush( vTemp, 2*Entry );
            Vec_IntPush( vTemp, 2*Entry+1 );
        }
//        printf( "\n" );
        Vec_IntFree( vRemain );
        vRemain = vTemp;
        Gia_ManStop( p );
        p = pInit;
    }


    // derive the resulting AIG
    pPart = Gia_ManDupCones( p, Vec_IntArray(vRemain), Vec_IntSize(vRemain), 0 );
    Vec_IntFree( vRemain );
    // report the results
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    if ( !fDualOut )
        printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
            Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    else
        printf( "Reduced %d dual outputs to %d dual outputs.  ", Gia_ManPoNum(p)/2, Gia_ManPoNum(pPart)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = vEquivs;
    else
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}